

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodecpp_assert.cpp
# Opt level: O0

void nodecpp::assert::onAssertionFailed(char *file,int line,char *condString,bool shouldThrow)

{
  exception *this;
  bool shouldThrow_local;
  char *condString_local;
  int line_local;
  char *file_local;
  
  log::default_log::error<char_const*,char_const*,int,char_const*>
            ("File \"{}\", line {}: assertion \'{}\' failed",file,line,condString);
  if (shouldThrow) {
    this = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this);
    __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
  }
  abort();
}

Assistant:

void onAssertionFailed( const char* file, int line, const char* condString, bool shouldThrow)
	{
		nodecpp::log::default_log::error( "File \"{}\", line {}: assertion \'{}\' failed", file, line, condString );
		if ( shouldThrow )
			throw std::exception();
		else
			std::abort();
	}